

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

mz_bool mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint src_file_index)

{
  mz_zip_internal_state *pArray;
  mz_zip_internal_state *pmVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  mz_bool mVar5;
  size_t sVar6;
  int *piVar7;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  mz_uint8 *pExt;
  mz_uint64 mVar12;
  void *pvVar13;
  void *pvVar14;
  ulong uVar15;
  ulong uVar16;
  int *pCentral_dir_header;
  uint uVar17;
  mz_zip_array file_data_array;
  mz_uint64 local_dir_header_ofs;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat src_file_stat;
  mz_uint32 *in_stack_fffffffffffffaa0;
  uint local_544;
  void *local_540;
  int local_534;
  ulong local_530;
  mz_uint64 local_528;
  uint local_51c;
  mz_zip_array local_518;
  undefined6 uStack_4f8;
  undefined8 uStack_4f2;
  mz_zip_array local_4e8;
  short *local_4c8;
  ulong local_4c0;
  ulong local_4b8;
  ulong local_4b0;
  int local_4a8;
  byte local_4a2;
  int local_496;
  int local_492;
  ushort local_48e;
  ushort local_48c;
  mz_zip_archive_file_stat local_488;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
     (pSource_zip->m_pRead == (mz_file_read_func)0x0)) {
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
LAB_001205de:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  pmVar1 = pSource_zip->m_pState;
  if ((pmVar1->m_zip64 != 0) && (pArray->m_zip64 == 0)) goto LAB_001205de;
  if ((pmVar1 == (mz_zip_internal_state *)0x0 || pSource_zip == (mz_zip_archive *)0x0) ||
     (pSource_zip->m_total_files <= src_file_index)) {
    pCentral_dir_header = (int *)0x0;
  }
  else {
    pCentral_dir_header =
         (int *)((ulong)*(uint *)((long)(pmVar1->m_central_dir_offsets).m_p +
                                 (ulong)src_file_index * 4) + (long)(pmVar1->m_central_dir).m_p);
  }
  if (pCentral_dir_header == (int *)0x0) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (*pCentral_dir_header != 0x2014b50) {
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  local_4b8 = (ulong)*(ushort *)(pCentral_dir_header + 7);
  local_4c0 = (ulong)*(ushort *)(pCentral_dir_header + 8);
  local_51c = (uint)*(ushort *)((long)pCentral_dir_header + 0x1e);
  local_540 = (void *)(ulong)((uint)*(ushort *)(pCentral_dir_header + 8) +
                              (uint)*(ushort *)(pCentral_dir_header + 7) + local_51c);
  if ((long)local_540 + ((pArray->m_central_dir).m_size - 0xffffffb1) < 0xffffffff00000001) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  if (pZip->m_file_offset_alignment == 0) {
    uVar4 = 0;
  }
  else {
    iVar11 = (int)pZip->m_file_offset_alignment;
    uVar4 = iVar11 - 1;
    uVar4 = iVar11 - ((uint)pZip->m_archive_size & uVar4) & uVar4;
  }
  if (pArray->m_zip64 == 0) {
    if (pZip->m_total_files == 0xffff) goto LAB_0012086d;
  }
  else if (pZip->m_total_files == 0xffffffff) {
LAB_0012086d:
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  mVar5 = mz_zip_file_stat_internal
                    (pSource_zip,src_file_index,(mz_uint8 *)pCentral_dir_header,&local_488,
                     (mz_bool *)0x0);
  mVar12 = local_488.m_local_header_ofs;
  if (mVar5 == 0) {
    return 0;
  }
  local_528 = pZip->m_archive_size;
  sVar6 = (*pSource_zip->m_pRead)
                    (pSource_zip->m_pIO_opaque,local_488.m_local_header_ofs,&local_4a8,0x1e);
  if (sVar6 != 0x1e) goto LAB_00120c58;
  if (local_4a8 != 0x4034b50) {
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  uVar15 = (ulong)local_48c;
  local_530 = local_488.m_comp_size + local_48e;
  local_534 = 0;
  if ((local_48c != 0) && ((local_496 == -1 || (local_534 = 0, local_492 == -1)))) {
    local_518.m_capacity._0_4_ = 0;
    local_518.m_capacity._4_4_ = 0;
    local_518._28_2_ = 0;
    local_518._30_2_ = 0;
    local_518.m_p = (short *)0x0;
    local_518.m_size = 0;
    local_518.m_element_size = 1;
    if ((uVar15 == 0) ||
       (mVar5 = mz_zip_array_ensure_capacity(pZip,&local_518,uVar15,0), mVar5 != 0)) {
      pvVar14 = local_518.m_p;
      local_518.m_size = uVar15;
      sVar6 = (*pSource_zip->m_pRead)
                        (pSource_zip->m_pIO_opaque,local_48e + local_488.m_local_header_ofs + 0x1e,
                         local_518.m_p,uVar15);
      if (sVar6 != uVar15) {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pvVar14);
        local_518.m_capacity._0_4_ = 0;
        local_518.m_capacity._4_4_ = 0;
        local_518.m_element_size = 0;
        local_518._28_2_ = 0;
        local_518._30_2_ = 0;
        local_518.m_p = (short *)0x0;
        local_518.m_size = 0;
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
        goto LAB_001208d2;
      }
      local_4c8 = (short *)pvVar14;
      local_534 = 0;
      uVar9 = uVar15;
      do {
        uVar17 = (uint)uVar9;
        if (uVar17 < 4) {
LAB_00120800:
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_518.m_p);
          local_518.m_capacity._0_4_ = 0;
          local_518.m_capacity._4_4_ = 0;
          local_518.m_element_size = 0;
          local_518._28_2_ = 0;
          local_518._30_2_ = 0;
          local_518.m_p = (short *)0x0;
          local_518.m_size = 0;
          pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
          iVar11 = 1;
LAB_00120825:
          bVar3 = false;
        }
        else {
          uVar10 = (ushort)local_4c8[1] + 4;
          if (uVar17 < uVar10) goto LAB_00120800;
          if (*local_4c8 == 1) {
            if ((ushort)local_4c8[1] < 0x10) goto LAB_00120800;
            local_534 = 1;
            iVar11 = 2;
            goto LAB_00120825;
          }
          local_4c8 = (short *)((long)local_4c8 + (ulong)uVar10);
          iVar11 = 0;
          bVar3 = true;
          uVar9 = (ulong)(uVar17 - uVar10);
        }
        if (iVar11 != 0) {
          if (iVar11 != 2) goto LAB_001208d6;
          break;
        }
      } while ((int)uVar9 != 0);
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_518.m_p);
      local_518.m_capacity._0_4_ = 0;
      local_518.m_capacity._4_4_ = 0;
      local_518.m_element_size = 0;
      local_518._28_2_ = 0;
      local_518._30_2_ = 0;
      local_518.m_p = (short *)0x0;
      local_518.m_size = 0;
      bVar3 = true;
    }
    else {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
LAB_001208d2:
      bVar3 = false;
      local_534 = 0;
    }
LAB_001208d6:
    if (!bVar3) {
      return 0;
    }
  }
  local_530 = local_530 + uVar15;
  if ((pArray->m_zip64 == 0) &&
     (0xfffffffe <
      (long)local_540 + (pArray->m_central_dir).m_size + local_530 + local_528 + uVar4 + 0xb2)) {
    pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
    return 0;
  }
  mVar5 = mz_zip_writer_write_zeros(pZip,local_528,uVar4);
  if (mVar5 == 0) {
    return 0;
  }
  uVar15 = local_528 + uVar4;
  local_4b0 = uVar15;
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & uVar15) != 0)) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyexr/deps/miniz/miniz.c"
                  ,0x1bfe,
                  "mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *, mz_zip_archive *, mz_uint)"
                 );
  }
  sVar6 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar15,&local_4a8,0x1e);
  if (sVar6 != 0x1e) {
LAB_00120ff8:
    pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
    return 0;
  }
  uVar9 = 0x10000;
  if (local_530 < 0x10000) {
    uVar9 = local_530;
  }
  sVar6 = 0x20;
  if (0x20 < uVar9) {
    sVar6 = uVar9;
  }
  piVar7 = (int *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,sVar6);
  if (piVar7 == (int *)0x0) goto LAB_00121026;
  mVar12 = mVar12 + 0x1e;
  local_528 = uVar15 + 0x1e;
  uVar15 = local_530;
  if (local_530 == 0) {
    sVar6 = (size_t)local_544;
  }
  else {
    do {
      sVar6 = 0x10000;
      if (uVar15 < 0x10000) {
        sVar6 = uVar15;
      }
      local_530 = uVar15;
      sVar8 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar12,piVar7,sVar6);
      local_544 = (uint)sVar6;
      if (sVar8 != sVar6) goto LAB_00120c4c;
      sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_528,piVar7,sVar6);
      if (sVar8 != sVar6) goto LAB_00120fec;
      mVar12 = mVar12 + sVar6;
      local_528 = local_528 + sVar6;
      uVar15 = local_530 - sVar6;
    } while (uVar15 != 0);
  }
  local_544 = (uint)sVar6;
  if ((local_4a2 & 8) != 0) {
    if (local_534 == 0 && pSource_zip->m_pState->m_zip64 == 0) {
      sVar6 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar12,piVar7,0x10);
      if (sVar6 == 0x10) {
        if (pZip->m_pState->m_zip64 == 0) {
          local_544 = (uint)(*piVar7 == 0x8074b50) * 4 + 0xc;
        }
        else {
          uVar15 = (ulong)(*piVar7 == 0x8074b50);
          uVar2 = *(undefined8 *)(piVar7 + uVar15);
          iVar11 = piVar7[uVar15 + 2];
          *piVar7 = 0x8074b50;
          *(undefined8 *)(piVar7 + 1) = uVar2;
          piVar7[3] = 0;
          piVar7[4] = iVar11;
          piVar7[5] = 0;
          local_544 = 0x18;
        }
      }
      else {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar7);
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
      }
      if (sVar6 != 0x10) {
        return 0;
      }
    }
    else {
      sVar6 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar12,piVar7,0x18);
      if (sVar6 != 0x18) {
LAB_00120c4c:
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar7);
LAB_00120c58:
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
        return 0;
      }
      local_544 = (uint)(*piVar7 == 0x8074b50) * 4 + 0x14;
    }
    uVar15 = (ulong)local_544;
    sVar6 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_528,piVar7,uVar15);
    if (sVar6 != uVar15) {
LAB_00120fec:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar7);
      goto LAB_00120ff8;
    }
    local_528 = local_528 + uVar15;
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar7);
  uVar15 = (pArray->m_central_dir).m_size;
  local_518.m_p = *(void **)pCentral_dir_header;
  local_518.m_size = *(size_t *)(pCentral_dir_header + 2);
  uVar2 = *(undefined8 *)(pCentral_dir_header + 6);
  uStack_4f8 = (undefined6)((ulong)*(undefined8 *)((long)pCentral_dir_header + 0x1e) >> 0x10);
  local_518.m_capacity._0_4_ = (undefined4)*(undefined8 *)(pCentral_dir_header + 4);
  local_518.m_capacity._4_4_ = (undefined4)((ulong)*(undefined8 *)(pCentral_dir_header + 4) >> 0x20)
  ;
  local_518.m_element_size = (mz_uint)uVar2;
  local_518._28_2_ = SUB82((ulong)uVar2 >> 0x20,0);
  local_518._30_2_ = SUB82((ulong)uVar2 >> 0x30,0);
  uStack_4f2._0_4_ = (undefined4)*(undefined8 *)((long)pCentral_dir_header + 0x26);
  if (pArray->m_zip64 == 0) {
    if ((local_528 >> 0x20 != 0) || (0xfffffffe < local_4b0)) {
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    uStack_4f2 = CONCAT44((int)local_4b0,(undefined4)uStack_4f2);
    uVar9 = uVar15 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar9) &&
       (mVar5 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar9,1), mVar5 == 0))
    goto LAB_00121026;
    (pArray->m_central_dir).m_size = uVar9;
    uVar9 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(uVar15 * uVar9 + (long)(pArray->m_central_dir).m_p),&local_518,uVar9 * 0x2e);
    sVar6 = (pArray->m_central_dir).m_size;
    uVar9 = sVar6 + (long)local_540;
    if (((pArray->m_central_dir).m_capacity < uVar9) &&
       (mVar5 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar9,1), mVar5 == 0)) {
      bVar3 = true;
    }
    else {
      (pArray->m_central_dir).m_size = uVar9;
      bVar3 = false;
    }
    if (local_540 != (void *)0x0 && !bVar3) {
      uVar9 = (ulong)(pArray->m_central_dir).m_element_size;
      memcpy((void *)(sVar6 * uVar9 + (long)(pArray->m_central_dir).m_p),
             (void *)((long)pCentral_dir_header + 0x2e),(long)local_540 * uVar9);
    }
joined_r0x00120ebf:
    if (!bVar3) {
      if (0xfffffffe < (pArray->m_central_dir).m_size) {
        if ((uVar15 <= (pArray->m_central_dir).m_capacity) ||
           (mVar5 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar15,0), mVar5 != 0))
        {
          (pArray->m_central_dir).m_size = uVar15;
        }
        pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
        return 0;
      }
      local_544 = (uint)uVar15;
      sVar6 = (pArray->m_central_dir_offsets).m_size;
      uVar9 = sVar6 + 1;
      if ((uVar9 <= (pArray->m_central_dir_offsets).m_capacity) ||
         (mVar5 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar9,1),
         mVar5 != 0)) {
        (pArray->m_central_dir_offsets).m_size = uVar9;
        uVar15 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
        memcpy((void *)(sVar6 * uVar15 + (long)(pArray->m_central_dir_offsets).m_p),&local_544,
               uVar15);
        pZip->m_total_files = pZip->m_total_files + 1;
        pZip->m_archive_size = local_528;
        return 1;
      }
    }
  }
  else {
    local_540 = (void *)(local_4b8 & 0xffffffff);
    pExt = (mz_uint8 *)((long)local_540 + (long)pCentral_dir_header + 0x2e);
    local_4e8.m_capacity = 0;
    local_4e8.m_p = (void *)0x0;
    local_4e8.m_size = 0;
    local_4e8.m_element_size = 1;
    local_4e8._28_4_ = 0;
    local_518.m_capacity._4_4_ = 0xffffffff;
    local_518.m_element_size = 0xffffffff;
    uStack_4f2 = CONCAT44(0xffffffff,(undefined4)uStack_4f2);
    mVar5 = mz_zip_writer_update_zip64_extension_block
                      (&local_4e8,pZip,pExt,local_51c,&local_488.m_comp_size,
                       &local_488.m_uncomp_size,&local_4b0,in_stack_fffffffffffffaa0);
    if (mVar5 == 0) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4e8.m_p);
      return 0;
    }
    local_530 = local_4e8.m_size;
    local_518._30_2_ = SUB82(local_4e8.m_size,0);
    sVar6 = (pArray->m_central_dir).m_size;
    uVar9 = sVar6 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar9) &&
       (mVar5 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar9,1), mVar5 == 0)) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4e8.m_p);
      goto LAB_00121026;
    }
    (pArray->m_central_dir).m_size = uVar9;
    uVar9 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(sVar6 * uVar9 + (long)(pArray->m_central_dir).m_p),&local_518,uVar9 * 0x2e);
    sVar6 = (pArray->m_central_dir).m_size;
    uVar9 = (long)local_540 + sVar6;
    if (((pArray->m_central_dir).m_capacity < uVar9) &&
       (mVar5 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar9,1), mVar5 == 0)) {
      bVar3 = true;
    }
    else {
      (pArray->m_central_dir).m_size = uVar9;
      bVar3 = false;
    }
    if ((int)local_4b8 != 0 && !bVar3) {
      uVar9 = (ulong)(pArray->m_central_dir).m_element_size;
      memcpy((void *)(sVar6 * uVar9 + (long)(pArray->m_central_dir).m_p),
             (void *)((long)pCentral_dir_header + 0x2e),(long)local_540 * uVar9);
    }
    if (bVar3) {
      pvVar14 = pZip->m_pAlloc_opaque;
      pvVar13 = local_4e8.m_p;
    }
    else {
      local_540 = local_4e8.m_p;
      sVar6 = (pArray->m_central_dir).m_size;
      uVar9 = sVar6 + local_530;
      if (((pArray->m_central_dir).m_capacity < uVar9) &&
         (mVar5 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar9,1), mVar5 == 0)) {
        bVar3 = true;
      }
      else {
        (pArray->m_central_dir).m_size = uVar9;
        bVar3 = false;
      }
      if (local_530 != 0 && !bVar3) {
        uVar9 = (ulong)(pArray->m_central_dir).m_element_size;
        memcpy((void *)(sVar6 * uVar9 + (long)(pArray->m_central_dir).m_p),local_540,
               local_530 * uVar9);
      }
      if (!bVar3) {
        uVar16 = local_4c0 & 0xffffffff;
        sVar6 = (pArray->m_central_dir).m_size;
        uVar9 = uVar16 + sVar6;
        if (((pArray->m_central_dir).m_capacity < uVar9) &&
           (mVar5 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar9,1), mVar5 == 0))
        {
          bVar3 = true;
        }
        else {
          (pArray->m_central_dir).m_size = uVar9;
          bVar3 = false;
        }
        if ((int)local_4c0 != 0 && !bVar3) {
          uVar9 = (ulong)(pArray->m_central_dir).m_element_size;
          memcpy((void *)(sVar6 * uVar9 + (long)(pArray->m_central_dir).m_p),pExt + local_51c,
                 uVar16 * uVar9);
        }
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_540);
        local_4e8.m_capacity = 0;
        local_4e8.m_element_size = 0;
        local_4e8._28_4_ = 0;
        local_4e8.m_p = (void *)0x0;
        local_4e8.m_size = 0;
        goto joined_r0x00120ebf;
      }
      pvVar14 = pZip->m_pAlloc_opaque;
      pvVar13 = local_540;
    }
    (*pZip->m_pFree)(pvVar14,pvVar13);
    local_4e8.m_capacity = 0;
    local_4e8.m_element_size = 0;
    local_4e8._28_4_ = 0;
    local_4e8.m_p = (void *)0x0;
    local_4e8.m_size = 0;
  }
  if ((uVar15 <= (pArray->m_central_dir).m_capacity) ||
     (mVar5 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar15,0), mVar5 != 0)) {
    (pArray->m_central_dir).m_size = uVar15;
  }
LAB_00121026:
  pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip, mz_zip_archive *pSource_zip, mz_uint src_file_index)
{
    mz_uint n, bit_flags, num_alignment_padding_bytes, src_central_dir_following_data_size;
    mz_uint64 src_archive_bytes_remaining, local_dir_header_ofs;
    mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint8 new_central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
    size_t orig_central_dir_size;
    mz_zip_internal_state *pState;
    void *pBuf;
    const mz_uint8 *pSrc_central_header;
    mz_zip_archive_file_stat src_file_stat;
    mz_uint32 src_filename_len, src_comment_len, src_ext_len;
    mz_uint32 local_header_filename_size, local_header_extra_len;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pSource_zip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    /* Don't support copying files from zip64 archives to non-zip64, even though in some cases this is possible */
    if ((pSource_zip->m_pState->m_zip64) && (!pZip->m_pState->m_zip64))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Get pointer to the source central dir header and crack it */
    if (NULL == (pSrc_central_header = mz_zip_get_cdh(pSource_zip, src_file_index)))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_SIG_OFS) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    src_filename_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    src_comment_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    src_ext_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS);
    src_central_dir_following_data_size = src_filename_len + src_ext_len + src_comment_len;

    /* TODO: We don't support central dir's >= MZ_UINT32_MAX bytes right now (+32 fudge factor in case we need to add more extra data) */
    if ((pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + 32) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    if (!pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        /* TODO: Our zip64 support still has some 32-bit limits that may not be worth fixing. */
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    if (!mz_zip_file_stat_internal(pSource_zip, src_file_index, pSrc_central_header, &src_file_stat, NULL))
        return MZ_FALSE;

    cur_src_file_ofs = src_file_stat.m_local_header_ofs;
    cur_dst_file_ofs = pZip->m_archive_size;

    /* Read the source archive's local dir header */
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Compute the total size we need to copy (filename+extra data+compressed data) */
    local_header_filename_size = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    src_archive_bytes_remaining = src_file_stat.m_comp_size + local_header_filename_size + local_header_extra_len ;

    /* Try to find a zip64 extended information field */
    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_zip_array file_data_array;
        const mz_uint8 *pExtra_data;
        mz_uint32 extra_size_remaining = local_header_extra_len;

        mz_zip_array_init(&file_data_array, 1);
        if (!mz_zip_array_resize(pZip, &file_data_array, local_header_extra_len, MZ_FALSE))
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, src_file_stat.m_local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_size, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_array_clear(pZip, &file_data_array);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }

        pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_array_clear(pZip, &file_data_array);
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64)); /* may be 0 if there's a descriptor */

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);

        mz_zip_array_clear(pZip, &file_data_array);
    }

    if (!pState->m_zip64)
    {
        /* Try to detect if the new archive will most likely wind up too big and bail early (+(sizeof(mz_uint32) * 4) is for the optional descriptor which could be present, +64 is a fudge factor). */
        /* We also check when the archive is finalized so this doesn't need to be perfect. */
        mz_uint64 approx_new_archive_size = cur_dst_file_ofs + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + src_archive_bytes_remaining + (sizeof(mz_uint32) * 4) +
                                            pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 64;

        if (approx_new_archive_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }

    /* Write dest archive padding */
    if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs, num_alignment_padding_bytes))
        return MZ_FALSE;

    cur_dst_file_ofs += num_alignment_padding_bytes;

    local_dir_header_ofs = cur_dst_file_ofs;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    /* The original zip's local header+ext block doesn't change, even with zip64, so we can just copy it over to the dest zip */
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Copy over the source archive bytes to the dest archive, also ensure we have enough buf space to handle optional data descriptor */
    if (NULL == (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)MZ_MAX(32U, MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining)))))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    while (src_archive_bytes_remaining)
    {
        n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining);
        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        cur_src_file_ofs += n;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_dst_file_ofs += n;

        src_archive_bytes_remaining -= n;
    }

    /* Now deal with the optional data descriptor */
    bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    if (bit_flags & 8)
    {
        /* Copy data descriptor */
        if ((pSource_zip->m_pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            /* src is zip64, dest must be zip64 */

            /* name			uint32_t's */
            /* id				1 (optional in zip64?) */
            /* crc			1 */
            /* comp_size	2 */
            /* uncomp_size 2 */
            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, (sizeof(mz_uint32) * 6)) != (sizeof(mz_uint32) * 6))
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID) ? 6 : 5);
        }
        else
        {
            /* src is NOT zip64 */
            mz_bool has_id;

            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            has_id = (MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID);

            if (pZip->m_pState->m_zip64)
            {
                /* dest is zip64, so upgrade the data descriptor */
                const mz_uint8 *pSrc_descriptor = (const mz_uint8 *)pBuf + (has_id ? sizeof(mz_uint32) : 0);
                const mz_uint32 src_crc32 = MZ_READ_LE32(pSrc_descriptor);
                const mz_uint64 src_comp_size = MZ_READ_LE32(pSrc_descriptor + sizeof(mz_uint32));
                const mz_uint64 src_uncomp_size = MZ_READ_LE32(pSrc_descriptor + 2*sizeof(mz_uint32));

                mz_write_le32((mz_uint8 *)pBuf, MZ_ZIP_DATA_DESCRIPTOR_ID);
                mz_write_le32((mz_uint8 *)pBuf + sizeof(mz_uint32) * 1, src_crc32);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 2, src_comp_size);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 4, src_uncomp_size);

                n = sizeof(mz_uint32) * 6;
            }
            else
            {
                /* dest is NOT zip64, just copy it as-is */
                n = sizeof(mz_uint32) * (has_id ? 4 : 3);
            }
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_src_file_ofs += n;
        cur_dst_file_ofs += n;
    }
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

    /* Finally, add the new central dir header */
    orig_central_dir_size = pState->m_central_dir.m_size;

    memcpy(new_central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);

    if (pState->m_zip64)
    {
        /* This is the painful part: We need to write a new central dir header + ext block with updated zip64 fields, and ensure the old fields (if any) are not included. */
        const mz_uint8 *pSrc_ext = pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len;
        mz_zip_array new_ext_block;

        mz_zip_array_init(&new_ext_block, sizeof(mz_uint8));

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, MZ_UINT32_MAX);

        if (!mz_zip_writer_update_zip64_extension_block(&new_ext_block, pZip, pSrc_ext, src_ext_len, &src_file_stat.m_comp_size, &src_file_stat.m_uncomp_size, &local_dir_header_ofs, NULL))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return MZ_FALSE;
        }

        MZ_WRITE_LE16(new_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS, new_ext_block.m_size);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_filename_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_ext_block.m_p, new_ext_block.m_size))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len + src_ext_len, src_comment_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        mz_zip_array_clear(pZip, &new_ext_block);
    }
    else
    {
        /* sanity checks */
        if (cur_dst_file_ofs > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (local_dir_header_ofs >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, local_dir_header_ofs);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_central_dir_following_data_size))
        {
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }
    }

    /* This shouldn't trigger unless we screwed up during the initial sanity checks */
    if (pState->m_central_dir.m_size >= MZ_UINT32_MAX)
    {
        /* TODO: Support central dirs >= 32-bits in size */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);
    }

    n = (mz_uint32)orig_central_dir_size;
    if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1))
    {
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    pZip->m_total_files++;
    pZip->m_archive_size = cur_dst_file_ofs;

    return MZ_TRUE;
}